

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O3

void es::init::report_singletons_stack(void)

{
  singletons_meta_data **ppsVar1;
  ostream *poVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uVar5;
  char *__s;
  
  uVar5 = static_obj_stack<es::init::singletons_meta_data>::top._u._s._p;
  if (static_obj_stack<es::init::singletons_meta_data>::top._u._s._p != (singletons_meta_data *)0x0)
  {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"singletons_stack_meta_data_node[",0x20);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"singleton meta data: ",0x15);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," p: ",4);
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," init count: ",0xd);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," flags: ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," func name: ",0xc);
      __s = ((singletons_meta_data *)uVar5)->_func_name;
      if (__s == (char *)0x0) {
        __s = "\'\'";
      }
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      ppsVar1 = &((singletons_meta_data *)uVar5)->_next;
      uVar5 = *ppsVar1;
    } while (*ppsVar1 != (singletons_meta_data *)0x0);
  }
  return;
}

Assistant:

inline void report_singletons_stack()
{
    uint64_t n{0};
    for (singletons_meta_data* p = stack::top._u._s._p; p != nullptr; p = p->_next)
    {
        std::cout << "singletons_stack_meta_data_node[" << n << "]: " << *p << std::endl;
        ++n;
    }
}